

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luac.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  lua_State *L_00;
  char *message;
  int i;
  lua_State *L;
  char **argv_local;
  int argc_local;
  
  iVar1 = doargs(argc,argv);
  if (argc - iVar1 < 1) {
    usage("no input files given");
  }
  L_00 = luaL_newstate();
  if (L_00 == (lua_State *)0x0) {
    fatal("cannot create state: not enough memory");
  }
  lua_pushcclosure(L_00,pmain,0);
  lua_pushinteger(L_00,(long)(argc - iVar1));
  lua_pushlightuserdata(L_00,argv + iVar1);
  iVar1 = lua_pcallk(L_00,2,0,0,0,(lua_KFunction)0x0);
  if (iVar1 != 0) {
    message = lua_tolstring(L_00,-1,(size_t *)0x0);
    fatal(message);
  }
  lua_close(L_00);
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
    lua_State *L;
    int i = doargs(argc, argv);
    argc -= i;
    argv += i;
    if (argc <= 0) usage("no input files given");
    L = luaL_newstate();
    if (L == NULL) fatal("cannot create state: not enough memory");
    lua_pushcfunction(L, &pmain);
    lua_pushinteger(L, argc);
    lua_pushlightuserdata(L, argv);
    if (lua_pcall(L, 2, 0, 0) != LUA_OK) fatal(lua_tostring(L, -1));
    lua_close(L);
    return EXIT_SUCCESS;
}